

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testValidateQuoteRequest(int count)

{
  long lVar1;
  long lVar2;
  int local_9d4;
  int j;
  long start;
  DataDictionary dataDictionary;
  OrdType local_5e0;
  allocator<char> local_579;
  CURRENCY local_578;
  Currency local_558;
  QTY local_4f8;
  OrderQty local_4f0;
  Side local_490;
  PRICE local_430;
  StrikePrice local_428;
  PutOrCall local_3c8;
  MaturityMonthYear local_368;
  allocator<char> local_301;
  STRING local_300;
  Symbol local_2e0;
  int local_27c;
  undefined1 local_278 [4];
  int i;
  NoRelatedSym noRelatedSym;
  allocator<char> local_1e9;
  STRING local_1e8;
  QuoteReqID local_1c8;
  undefined1 local_168 [8];
  QuoteRequest message;
  int count_local;
  
  message.super_Message._340_4_ = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"1",&local_1e9);
  FIX::QuoteReqID::QuoteReqID(&local_1c8,&local_1e8);
  FIX42::QuoteRequest::QuoteRequest((QuoteRequest *)local_168,&local_1c8);
  FIX::QuoteReqID::~QuoteReqID(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_278);
  for (local_27c = 1; local_27c < 0xb; local_27c = local_27c + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"IBM",&local_301);
    FIX::Symbol::Symbol(&local_2e0,&local_300);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_2e0);
    FIX::Symbol::~Symbol(&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    FIX::MaturityMonthYear::MaturityMonthYear(&local_368);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_368);
    FIX::MaturityMonthYear::~MaturityMonthYear(&local_368);
    FIX::PutOrCall::PutOrCall(&local_3c8,&FIX::PutOrCall_PUT);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_3c8);
    FIX::PutOrCall::~PutOrCall(&local_3c8);
    local_430 = 120.0;
    FIX::StrikePrice::StrikePrice(&local_428,&local_430);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_428);
    FIX::StrikePrice::~StrikePrice(&local_428);
    FIX::Side::Side(&local_490,"11");
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_490);
    FIX::Side::~Side(&local_490);
    local_4f8 = 100.0;
    FIX::OrderQty::OrderQty(&local_4f0,&local_4f8);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_4f0);
    FIX::OrderQty::~OrderQty(&local_4f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"USD",&local_579);
    FIX::Currency::Currency(&local_558,&local_578);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_558);
    FIX::Currency::~Currency(&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    FIX::OrdType::OrdType(&local_5e0,"1");
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_278,&local_5e0);
    FIX::OrdType::~OrdType(&local_5e0);
    FIX::Message::addGroup((Message *)local_168,(Group *)local_278);
  }
  FIX::DataDictionary::DataDictionary((DataDictionary *)&start);
  message.super_Message._340_4_ = message.super_Message._340_4_ + -1;
  lVar1 = GetTickCount();
  for (local_9d4 = 0; local_9d4 <= (int)message.super_Message._340_4_; local_9d4 = local_9d4 + 1) {
    FIX::DataDictionary::validate((DataDictionary *)&start,(Message *)local_168);
  }
  lVar2 = GetTickCount();
  FIX::DataDictionary::~DataDictionary((DataDictionary *)&start);
  FIX42::QuoteRequest::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)local_278);
  FIX42::QuoteRequest::~QuoteRequest((QuoteRequest *)local_168);
  return lVar2 - lVar1;
}

Assistant:

long testValidateQuoteRequest( int count )
{
  FIX42::QuoteRequest message( FIX::QuoteReqID("1") );
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for( int i = 1; i <= 10; ++i )
  {
    noRelatedSym.set( FIX::Symbol("IBM") );
    noRelatedSym.set( FIX::MaturityMonthYear() );
    noRelatedSym.set( FIX::PutOrCall(FIX::PutOrCall_PUT) );
    noRelatedSym.set( FIX::StrikePrice(120) );
    noRelatedSym.set( FIX::Side(FIX::Side_BUY) );
    noRelatedSym.set( FIX::OrderQty(100) );
    noRelatedSym.set( FIX::Currency("USD") );
    noRelatedSym.set( FIX::OrdType(FIX::OrdType_MARKET) );
    message.addGroup( noRelatedSym );
  }

  FIX::DataDictionary dataDictionary;
  count = count - 1;

  long start = GetTickCount();
  for ( int j = 0; j <= count; ++j )
  {
    dataDictionary.validate( message );
  }
  return GetTickCount() - start;
}